

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

bool ApprovalTests::TestName::registerRootDirectoryFromMainFile(string *file)

{
  pointer pcVar1;
  ostream *poVar2;
  runtime_error *this;
  string adjustedPath;
  string local_50;
  string local_30;
  
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,"TestName::registerRootDirectoryFromMainFile from __FILE__ ",
             0x3a);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&::std::cout,(file->_M_dataplus)._M_p,file->_M_string_length);
  local_50._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_50,1);
  if (file->_M_string_length != 0) {
    pcVar1 = (file->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + file->_M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&::std::cout,"TestName::registerRootDirectoryFromMainFile found parent  ",
               0x3a);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&::std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
    ;
    local_30._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_30,1);
    FileUtils::getDirectory(&local_30,&local_50);
    rootDirectoryStorage_abi_cxx11_();
    ::std::__cxx11::string::operator=
              ((string *)&rootDirectoryStorage[abi:cxx11]()::rootDirectory_abi_cxx11_,
               (string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&::std::cout,"TestName::registerRootDirectoryFromMainFile result        ",
               0x3a);
    rootDirectoryStorage_abi_cxx11_();
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&::std::cout,
                        rootDirectoryStorage[abi:cxx11]()::rootDirectory_abi_cxx11_._M_dataplus._M_p
                        ,rootDirectoryStorage[abi:cxx11]()::rootDirectory_abi_cxx11_.
                         _M_string_length);
    local_30._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return true;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"Cannot register an empty path as root directory");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TestName::registerRootDirectoryFromMainFile(const std::string& file)
    {
        std::cout << "TestName::registerRootDirectoryFromMainFile from __FILE__ " << file
                  << '\n';

        if (file.empty())
        {
            throw std::runtime_error("Cannot register an empty path as root directory");
        }

        std::string adjustedPath = file;
        std::cout << "TestName::registerRootDirectoryFromMainFile found parent  "
                  << adjustedPath << '\n';

        rootDirectoryStorage() = FileUtils::getDirectory(adjustedPath);
        std::cout << "TestName::registerRootDirectoryFromMainFile result        "
                  << rootDirectoryStorage() << '\n';

        return true;
    }